

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

void __thiscall
testing::
Matcher<const_std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
::Matcher(Matcher<const_std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
          *this,pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *value)

{
  pointer pcVar1;
  Enum EVar2;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  undefined8 uStack_68;
  MatcherBase<const_std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  local_60;
  Enum local_48;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  (this->
  super_MatcherBase<const_std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  ).vtable_ = (VTable *)0x0;
  (this->
  super_MatcherBase<const_std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  ).buffer_.ptr = (void *)0x0;
  (this->
  super_MatcherBase<const_std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0032c6e8;
  local_48 = value->first;
  pcVar1 = (value->second)._M_dataplus._M_p;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (value->second)._M_string_length);
  EVar2 = local_48;
  local_80 = &local_70;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_40,local_38 + (long)local_40);
  local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0032c758;
  local_60.buffer_.ptr = (void *)0x0;
  local_60.vtable_ =
       (VTable *)
       internal::MatcherBase<std::pair<phmap::priv::hash_internal::Enum,std::__cxx11::string>const&>
       ::
       GetVTable<testing::internal::MatcherBase<std::pair<phmap::priv::hash_internal::Enum,std::__cxx11::string>const&>::ValuePolicy<testing::internal::EqMatcher<std::pair<phmap::priv::hash_internal::Enum,std::__cxx11::string>>,false>>()
       ::kVTable_abi_cxx11_;
  local_60.buffer_.ptr = operator_new(0x30);
  ((local_60.buffer_.shared)->ref).super___atomic_base<int>._M_i = 1;
  *(Enum *)(local_60.buffer_.i + 8) = EVar2;
  *(undefined8 **)(local_60.buffer_.i + 0x10) = (undefined8 *)(local_60.buffer_.i + 0x20);
  if (local_80 == &local_70) {
    *(undefined8 *)(local_60.buffer_.i + 0x20) = CONCAT71(uStack_6f,local_70);
    *(undefined8 *)(local_60.buffer_.i + 0x28) = uStack_68;
  }
  else {
    *(undefined1 **)(local_60.buffer_.i + 0x10) = local_80;
    *(ulong *)(local_60.buffer_.i + 0x20) = CONCAT71(uStack_6f,local_70);
  }
  *(undefined8 *)(local_60.buffer_.i + 0x18) = local_78;
  local_78 = 0;
  local_70 = 0;
  local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0032c6e8;
  local_80 = &local_70;
  internal::
  MatcherBase<const_std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  ::operator=(&this->
               super_MatcherBase<const_std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
              ,&local_60);
  internal::
  MatcherBase<const_std::pair<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  ::~MatcherBase(&local_60);
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

Matcher<T>::Matcher(T value) {
  *this = Eq(value);
}